

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O1

HTTP_CLIENT_RESULT uhttp_client_set_trace(HTTP_CLIENT_HANDLE handle,_Bool trace_on,_Bool trace_data)

{
  LOGGER_LOG p_Var1;
  HTTP_CLIENT_RESULT HVar2;
  
  if (handle == (HTTP_CLIENT_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    HVar2 = HTTP_CLIENT_INVALID_ARG;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_set_trace",0x5cc,1,
                "invalid parameter (NULL) passed to http_client_set_trace");
    }
  }
  else {
    handle->trace_on = trace_on;
    handle->trace_body = trace_data;
    HVar2 = HTTP_CLIENT_OK;
  }
  return HVar2;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_set_trace(HTTP_CLIENT_HANDLE handle, bool trace_on, bool trace_data)
{
    HTTP_CLIENT_RESULT result;
    if (handle == NULL)
    {
        /* Codes_SRS_UHTTP_07_038: [If handle is NULL then http_client_set_trace shall return HTTP_CLIENT_INVALID_ARG] */
        result = HTTP_CLIENT_INVALID_ARG;
        LogError("invalid parameter (NULL) passed to http_client_set_trace");
    }
    else
    {
        /* Codes_SRS_UHTTP_07_039: [http_client_set_trace shall set the HTTP tracing to the trace_on variable.] */
        handle->trace_on = trace_on;
        handle->trace_body = trace_data;
        /* Codes_SRS_UHTTP_07_040: [if http_client_set_trace finishes successfully then it shall return HTTP_CLIENT_OK.] */
        result = HTTP_CLIENT_OK;
    }
    return result;
}